

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderhacks.cpp
# Opt level: O3

bool __thiscall FDrawInfo::DoOneSectorUpper(FDrawInfo *this,subsector_t *subsec,float Planez)

{
  double dVar1;
  uint uVar2;
  seg_t *psVar3;
  subsector_t *subsec_00;
  bool bVar4;
  sector_t *psVar5;
  ulong uVar6;
  long lVar7;
  
  uVar6 = (ulong)subsec->numlines;
  if (uVar6 != 0) {
    lVar7 = 0;
    do {
      if (*(long *)((long)&subsec->firstline->backsector + lVar7) == 0) {
        return false;
      }
      if (*(long *)((long)&subsec->firstline->PartnerSeg + lVar7) == 0) {
        return false;
      }
      lVar7 = lVar7 + 0x48;
    } while (uVar6 * 0x48 != lVar7);
    if (uVar6 != 0) {
      lVar7 = 0x30;
      uVar6 = 0;
      do {
        psVar3 = subsec->firstline;
        subsec_00 = *(subsector_t **)(*(long *)((long)&psVar3->v1 + lVar7) + 0x38);
        if (subsec_00->validcount != validcount) {
          subsec_00->validcount = validcount;
          psVar5 = *(sector_t **)((long)psVar3 + lVar7 + -8);
          if ((*(sector_t **)((long)psVar3 + lVar7 + -0x10) != psVar5) &&
             (*(long *)((long)psVar3 + lVar7 + -0x18) != 0)) {
            psVar5 = gl_FakeFlat(psVar5,&fakesec,in_area,true);
            if (((psVar5->ceilingplane).normal.Y != 0.0 || (psVar5->ceilingplane).normal.X != 0.0)
               || (dVar1 = psVar5->planes[1].TexZ, dVar1 < (double)Planez)) {
              return false;
            }
            if (dVar1 == (double)Planez) {
              uVar2 = *(uint *)(*(long *)((long)psVar3 + lVar7 + -0x20) + 0x30);
              if (((uVar2 < TexMan.Textures.Count) &&
                  (TexMan.Textures.Array[(int)uVar2].Texture != (FTexture *)0x0)) &&
                 ((TexMan.Textures.Array[(int)uVar2].Texture)->UseType != '\r')) {
                return false;
              }
              goto LAB_00471a75;
            }
          }
          bVar4 = DoOneSectorUpper(this,subsec_00,Planez);
          if (!bVar4) {
            return false;
          }
        }
LAB_00471a75:
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0x48;
      } while (uVar6 < subsec->numlines);
    }
  }
  TArray<subsector_t_*,_subsector_t_*>::Grow(&this->HandledSubsectors,1);
  uVar2 = (this->HandledSubsectors).Count;
  (this->HandledSubsectors).Array[uVar2] = subsec;
  (this->HandledSubsectors).Count = uVar2 + 1;
  return true;
}

Assistant:

bool FDrawInfo::DoOneSectorUpper(subsector_t * subsec, float Planez)
{
	// Is there a one-sided wall in this sector?
	// Do this first to avoid unnecessary recursion
	for (DWORD i = 0; i < subsec->numlines; i++)
	{
		if (subsec->firstline[i].backsector == NULL) return false;
		if (subsec->firstline[i].PartnerSeg == NULL) return false;
	}

	for (DWORD i = 0; i < subsec->numlines; i++)
	{
		seg_t * seg = subsec->firstline + i;
		subsector_t * backsub = seg->PartnerSeg->Subsector;

		// already checked?
		if (backsub->validcount == validcount) continue;
		backsub->validcount = validcount;

		if (seg->frontsector != seg->backsector && seg->linedef)
		{
			// Note: if this is a real line between sectors
			// we can be sure that render_sector is the real sector!

			sector_t * sec = gl_FakeFlat(seg->backsector, &fakesec, true);

			// Don't bother with slopes
			if (sec->ceilingplane.isSlope())  return false;

			// Is the neighboring ceiling lower than the desired height?
			if (sec->GetPlaneTexZ(sector_t::ceiling) < Planez)
			{
				// todo: check for missing textures.
				return false;
			}

			// This is an exact height match which means we don't have to do any further checks for this sector
			if (sec->GetPlaneTexZ(sector_t::ceiling) == Planez)
			{
				// If there's a texture abort
				FTexture * tex = TexMan[seg->sidedef->GetTexture(side_t::top)];
				if (!tex || tex->UseType == FTexture::TEX_Null) continue;
				else return false;
			}
		}
		if (!DoOneSectorUpper(backsub, Planez)) return false;
	}
	// all checked ok. This subsector is part of the current fake plane

	HandledSubsectors.Push(subsec);
	return 1;
}